

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t driver::zeEventPoolCloseIpcHandle(ze_event_pool_handle_t hEventPool)

{
  ze_pfnEventPoolCloseIpcHandle_t pfnCloseIpcHandle;
  ze_result_t result;
  ze_event_pool_handle_t hEventPool_local;
  
  pfnCloseIpcHandle._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c5b0 != (code *)0x0) {
    pfnCloseIpcHandle._4_4_ = (*DAT_0011c5b0)(hEventPool);
  }
  return pfnCloseIpcHandle._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventPoolCloseIpcHandle(
        ze_event_pool_handle_t hEventPool               ///< [in][release] handle of event pool object
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnCloseIpcHandle = context.zeDdiTable.EventPool.pfnCloseIpcHandle;
        if( nullptr != pfnCloseIpcHandle )
        {
            result = pfnCloseIpcHandle( hEventPool );
        }
        else
        {
            // generic implementation

        }

        return result;
    }